

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O1

void * FilterRender::doSlice
                 (void *data,uint width,uint height,
                 vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly)

{
  ulong uVar1;
  bool bVar2;
  int i;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int i_2;
  ulong uVar8;
  Point local_68;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> *local_58;
  double local_50;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_48;
  
  uVar1 = (ulong)width;
  uVar5 = (ulong)height;
  local_58 = poly;
  pvVar3 = operator_new__(uVar5 * 8);
  if (height != 0) {
    uVar8 = 0;
    do {
      pvVar4 = operator_new__(uVar1 * 8);
      *(void **)((long)pvVar3 + uVar8 * 8) = pvVar4;
      if (width != 0) {
        uVar7 = 0;
        do {
          pvVar4 = operator_new__(4);
          *(void **)(*(long *)((long)pvVar3 + uVar8 * 8) + uVar7 * 8) = pvVar4;
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    uVar8 = 0;
    pvVar4 = data;
    do {
      if (width != 0) {
        uVar7 = 0;
        do {
          lVar6 = 0;
          do {
            *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar8 * 8) + uVar7 * 8) + lVar6) =
                 *(undefined1 *)((long)pvVar4 + lVar6);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          pvVar4 = (void *)((long)pvVar4 + 4);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    uVar8 = 0;
    do {
      if (width != 0) {
        local_50 = (double)(int)uVar8;
        uVar7 = 0;
        do {
          Geometry::Point::Point(&local_68,local_50,(double)(int)uVar7);
          std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector(&local_48,local_58)
          ;
          bVar2 = Geometry::InPoly(&local_68,&local_48);
          std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_48);
          Geometry::Point::~Point(&local_68);
          if (!bVar2) {
            lVar6 = 0;
            do {
              *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar8 * 8) + uVar7 * 8) + lVar6) =
                   0;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 4);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    uVar8 = 0;
    do {
      if (width != 0) {
        uVar7 = 0;
        do {
          lVar6 = 0;
          do {
            *(undefined1 *)((long)data + lVar6) =
                 *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar8 * 8) + uVar7 * 8) + lVar6)
            ;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          data = (void *)((long)data + 4);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
    uVar8 = 0;
    do {
      if (width != 0) {
        uVar7 = 0;
        do {
          pvVar4 = *(void **)(*(long *)((long)pvVar3 + uVar8 * 8) + uVar7 * 8);
          if (pvVar4 != (void *)0x0) {
            operator_delete__(pvVar4);
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      pvVar4 = *(void **)((long)pvVar3 + uVar8 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
  }
  operator_delete__(pvVar3);
}

Assistant:

void* FilterRender::doSlice(void *data, uint width, uint height, std::vector<Point> poly) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			if (!InPoly(Point(i, j), poly)) {
				for (int k = 0; k < 4; k++) {
					map[i][j][k] = 0;
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}